

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O1

void __thiscall dnet::data_types::matrix::matrix(matrix *this,double def,axes_type *size)

{
  pointer pdVar1;
  double *x;
  pointer pdVar2;
  vector<double,_std::allocator<double>_> *__range2;
  
  tensor<double,_2U>::tensor
            (&this->super_tensor<double,_2U>,(array<unsigned_int,_2UL>)*&size->_M_elems);
  pdVar1 = (this->super_tensor<double,_2U>)._data.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  for (pdVar2 = (this->super_tensor<double,_2U>)._data.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start; pdVar2 != pdVar1; pdVar2 = pdVar2 + 1) {
    *pdVar2 = def;
  }
  return;
}

Assistant:

matrix::matrix(double def, const axes_type &size) : tensor(def, size) {}